

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncExecutor.h
# Opt level: O3

void __thiscall
nrg::SyncExecutor::operator()
          (SyncExecutor *this,
          _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_int_ptr *fn,
          reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param,int *param_3)

{
  long *local_68;
  undefined8 local_60;
  code *local_58;
  undefined8 uStack_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_int_ptr *local_28;
  
  local_60 = 0;
  local_28 = fn;
  local_68 = (long *)operator_new(0x18);
  *local_68 = (long)&local_28;
  local_68[1] = (long)param;
  local_68[2] = (long)param_3;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/norinrg[P]executor/./executor/SyncExecutor.h:57:20)>
             ::_M_invoke;
  local_48._8_8_ = local_60;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/norinrg[P]executor/./executor/SyncExecutor.h:57:20)>
             ::_M_manager;
  local_58 = (code *)0x0;
  uStack_50 = 0;
  local_48._M_unused._M_object = local_68;
  operator()(this,(Function *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,3);
    }
  }
  return;
}

Assistant:

void operator()(FN fn, Param&&... param)
    {
        Function f([&]() { fn(std::forward<Param>(param)...); });
        (*this)(std::move(f));
    }